

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall helics::CommsInterface::~CommsInterface(CommsInterface *this)

{
  this->_vptr_CommsInterface = (_func_int **)&PTR__CommsInterface_004da118;
  join_tx_rx_thread(this);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->tripDetector).lineDetector.
              super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CLI::std::thread::~thread((thread *)&this->queue_watcher);
  CLI::std::thread::~thread((thread *)&this->queue_transmitter);
  gmlc::containers::
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::~BlockingPriorityQueue(&this->txQueue);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->loggingCallback);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->ActionCallback);
  gmlc::concurrency::TriggerVariable::~TriggerVariable(&this->txTrigger);
  std::__cxx11::string::~string((string *)&this->randomID);
  std::__cxx11::string::~string((string *)&this->brokerInitString);
  std::__cxx11::string::~string((string *)&this->brokerName);
  std::__cxx11::string::~string((string *)&this->brokerTargetAddress);
  std::__cxx11::string::~string((string *)&this->localTargetAddress);
  std::__cxx11::string::~string((string *)&this->name);
  gmlc::concurrency::TriggerVariable::~TriggerVariable(&this->rxTrigger);
  return;
}

Assistant:

CommsInterface::~CommsInterface()
{
    join_tx_rx_thread();
}